

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swipe.cc
# Opt level: O0

void sptk::swipe::Snth(matrix S,vector x,vector pc,vector fERBs,vector d,intvector ws,intvector ps,
                      double nyquist,double nyquist2,double dt,int n)

{
  vector yr_vector;
  vector yr_vector_00;
  vector fERBs_00;
  matrix L_00;
  matrix S_00;
  intvector ps_00;
  vector pci_00;
  int iVar1;
  double *extraout_RDX;
  int *in_RSI;
  undefined8 in_RDI;
  long in_R9;
  matrix mVar3;
  vector vVar4;
  vector vVar5;
  undefined8 in_stack_00000008;
  double *in_stack_00000010;
  ulong in_stack_00000018;
  long in_stack_00000020;
  double *in_stack_00000038;
  undefined8 in_stack_00000040;
  int in_stack_00000048;
  int in_stack_00000090;
  int in_stack_00000094;
  double in_stack_00000098;
  undefined1 in_stack_000000a0 [16];
  vector in_stack_000000b0;
  int ti;
  vector pci;
  vector mu;
  int psz;
  int hi;
  int lo;
  matrix L;
  int w2;
  int i;
  double **ppdVar6;
  double in_stack_fffffffffffffe88;
  double in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  int in_stack_ffffffffffffff00;
  int local_fc;
  undefined4 uStack_f4;
  undefined4 uStack_e4;
  int local_6c;
  double **ppdVar2;
  
  mVar3 = loudness(in_stack_000000b0,(vector)in_stack_000000a0,in_stack_00000098,in_stack_00000094,
                   in_stack_00000090);
  vVar4.v = mVar3.m;
  vVar4._0_8_ = in_stack_00000020;
  local_6c = bisectv((swipe *)(in_stack_00000018 & 0xffffffff),vVar4,(double)in_stack_00000048);
  vVar5.v = extraout_RDX;
  vVar5._0_8_ = in_stack_00000020;
  iVar1 = bisectv((swipe *)(in_stack_00000018 & 0xffffffff),vVar5,(double)(in_stack_00000048 + 2));
  vVar4 = makev(0);
  vVar5 = makev(0);
  ppdVar2 = (double **)vVar5.v;
  local_fc = 0;
  for (; local_6c < iVar1; local_6c = local_6c + 1) {
    ppdVar2[local_fc] = *(double **)(in_R9 + (long)local_6c * 8);
    vVar4.v[local_fc] =
         1.0 - ABS(*(double *)(in_stack_00000020 + (long)local_6c * 8) -
                   (double)(in_stack_00000048 + 1));
    local_fc = local_fc + 1;
  }
  pci_00.v = in_stack_00000010;
  pci_00._0_8_ = in_stack_00000008;
  ppdVar6 = (double **)CONCAT44(uStack_f4,vVar5.x);
  L_00.m._4_4_ = uStack_e4;
  L_00.m._0_4_ = vVar4.x;
  S_00.m = ppdVar6;
  S_00._0_8_ = vVar4.v;
  L_00._0_8_ = in_stack_00000040;
  fERBs_00.v = in_stack_00000038;
  fERBs_00._0_8_ = in_stack_fffffffffffffe98;
  ps_00.v = in_RSI;
  ps_00._0_8_ = in_RDI;
  Sadd(S_00,L_00,fERBs_00,pci_00,(vector)mVar3,ps_00,in_stack_fffffffffffffe90,
       in_stack_fffffffffffffe88,in_stack_ffffffffffffff00,vVar5.x,(int)vVar5.v);
  mVar3.m = ppdVar2;
  mVar3._0_8_ = ppdVar6;
  freem(mVar3);
  yr_vector.v = (double *)ppdVar2;
  yr_vector._0_8_ = ppdVar6;
  freev(yr_vector);
  yr_vector_00.v = (double *)ppdVar2;
  yr_vector_00._0_8_ = ppdVar6;
  freev(yr_vector_00);
  return;
}

Assistant:

void Snth(matrix S, vector x, vector pc, vector fERBs, vector d,
                              intvector ws, intvector ps, double nyquist, 
                              double nyquist2, double dt, int n) {
    int i;
    int w2 = ws.v[n] / 2;
    matrix L = loudness(x, fERBs, nyquist, ws.v[n], w2);
    int lo = bisectv(d, n); // start of Snth-specific code
    int hi = bisectv(d, n + 2);
    int psz = hi - lo;
    vector mu = makev(psz);
    vector pci = makev(psz);
    int ti = 0;
    for (i = lo; i < hi; i++) {
        pci.v[ti] = pc.v[i];
        mu.v[ti] = 1. - fabs(d.v[i] - (n + 1));
        ti++;
    } // end of Snth-specific code
    Sadd(S, L, fERBs, pci, mu, ps, dt, nyquist2, lo, psz, w2); 
    freem(L);
    freev(mu);
    freev(pci); 
}